

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::FinalizeTargetConfiguration
          (cmTarget *this,cmBTStringRange *noConfigCompileDefinitions,
          optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
          *perConfigCompileDefinitions)

{
  cmValue prop;
  bool bVar1;
  TargetType TVar2;
  PolicyStatus PVar3;
  pointer pcVar4;
  cmMakefile *pcVar5;
  cmake *pcVar6;
  reference entry;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>
  *pmVar7;
  mapped_type *pmVar8;
  string *psVar9;
  cmake *in_R8;
  static_string_view sVar10;
  string_view property;
  string_view property_00;
  string_view property_01;
  byte local_211;
  optional<cmListFileBacktrace> local_200;
  cmValue local_1e8;
  cmValue val_1;
  cmAlphaNum local_1c0;
  cmAlphaNum local_190;
  undefined1 local_160 [8];
  string defPropName;
  string *c;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  optional<cmListFileBacktrace> local_f0;
  cmValue local_d8;
  cmValue val;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>
  *it;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>
  *__range3;
  PolicyStatus polSt;
  cmMakefile *mf;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *def;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __end1;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __begin1;
  cmBTStringRange *__range1;
  char *local_78;
  anon_unknown_dwarf_831db9 *local_60;
  char *local_58;
  anon_unknown_dwarf_831db9 *local_40;
  char *local_38;
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
  *perConfigCompileDefinitions_local;
  cmBTStringRange *noConfigCompileDefinitions_local;
  cmTarget *this_local;
  
  TVar2 = GetType(this);
  if (TVar2 != GLOBAL_TARGET) {
    sVar10 = ::cm::operator____s("LINK_LIBRARIES",0xe);
    local_40 = (anon_unknown_dwarf_831db9 *)sVar10.super_string_view._M_len;
    local_38 = sVar10.super_string_view._M_str;
    pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    pcVar5 = GetMakefile(this);
    pcVar6 = cmMakefile::GetCMakeInstance(pcVar5);
    property._M_str = (char *)&pcVar4->LinkImplementationPropertyEntries;
    property._M_len = (size_t)local_38;
    bVar1 = anon_unknown.dwarf_831db9::CheckLinkLibraryPattern
                      (local_40,property,
                       (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)pcVar6,in_R8);
    local_211 = 1;
    if (bVar1) {
      sVar10 = ::cm::operator____s("INTERFACE_LINK_LIBRARIES",0x18);
      local_60 = (anon_unknown_dwarf_831db9 *)sVar10.super_string_view._M_len;
      local_58 = sVar10.super_string_view._M_str;
      pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      pcVar5 = GetMakefile(this);
      pcVar6 = cmMakefile::GetCMakeInstance(pcVar5);
      property_00._M_str = (char *)&pcVar4->LinkInterfacePropertyEntries;
      property_00._M_len = (size_t)local_58;
      bVar1 = anon_unknown.dwarf_831db9::CheckLinkLibraryPattern
                        (local_60,property_00,
                         (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)pcVar6,in_R8);
      local_211 = 1;
      if (bVar1) {
        sVar10 = ::cm::operator____s("INTERFACE_LINK_LIBRARIES_DIRECT",0x1f);
        __range1 = (cmBTStringRange *)sVar10.super_string_view._M_len;
        local_78 = sVar10.super_string_view._M_str;
        pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        pcVar5 = GetMakefile(this);
        pcVar6 = cmMakefile::GetCMakeInstance(pcVar5);
        property_01._M_str = (char *)&pcVar4->LinkInterfaceDirectPropertyEntries;
        property_01._M_len = (size_t)local_78;
        bVar1 = anon_unknown.dwarf_831db9::CheckLinkLibraryPattern
                          ((anon_unknown_dwarf_831db9 *)__range1,property_01,
                           (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)pcVar6,in_R8);
        local_211 = bVar1 ^ 0xff;
      }
    }
    if ((local_211 & 1) == 0) {
      AppendBuildInterfaceIncludes(this);
      TVar2 = GetType(this);
      if (TVar2 != INTERFACE_LIBRARY) {
        __end1 = cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::begin(noConfigCompileDefinitions);
        def = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::end(noConfigCompileDefinitions);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                           *)&def), bVar1) {
          entry = __gnu_cxx::
                  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator*(&__end1);
          InsertCompileDefinition(this,entry);
          __gnu_cxx::
          __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator++(&__end1);
        }
        pcVar5 = GetMakefile(this);
        PVar3 = cmMakefile::GetPolicyStatus(pcVar5,CMP0043,false);
        if ((PVar3 == WARN) || (PVar3 == OLD)) {
          bVar1 = std::optional::operator_cast_to_bool((optional *)perConfigCompileDefinitions);
          if (bVar1) {
            pmVar7 = std::
                     optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
                     ::operator*(perConfigCompileDefinitions);
            __end3 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>
                     ::begin(pmVar7);
            it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>
                  *)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>
                    ::end(pmVar7);
            while (bVar1 = std::operator!=(&__end3,(_Self *)&it), bVar1) {
              val.Value = &std::
                           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>
                           ::operator*(&__end3)->first;
              local_d8.Value = (((reference)val.Value)->second).Value;
              bVar1 = cmValue::operator_cast_to_bool(&local_d8);
              prop.Value = val.Value;
              if (bVar1) {
                psVar9 = cmValue::operator*[abi_cxx11_(&local_d8);
                std::optional<cmListFileBacktrace>::optional();
                AppendProperty(this,prop.Value,psVar9,&local_f0,false);
                std::optional<cmListFileBacktrace>::~optional(&local_f0);
              }
              std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>
              ::operator++(&__end3);
            }
          }
          else {
            std::
            optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
            ::emplace<>(perConfigCompileDefinitions);
            cmMakefile::GetGeneratorConfigs_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range3_1,pcVar5,ExcludeEmptyConfig);
            __end3_1 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&__range3_1);
            c = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range3_1);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end3_1,
                                      (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&c), bVar1) {
              defPropName.field_2._8_8_ =
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end3_1);
              cmAlphaNum::cmAlphaNum(&local_190,"COMPILE_DEFINITIONS_");
              cmsys::SystemTools::UpperCase((string *)&val_1,(string *)defPropName.field_2._8_8_);
              cmAlphaNum::cmAlphaNum(&local_1c0,(string *)&val_1);
              cmStrCat<>((string *)local_160,&local_190,&local_1c0);
              std::__cxx11::string::~string((string *)&val_1);
              local_1e8 = cmMakefile::GetProperty(pcVar5,(string *)local_160);
              pmVar7 = std::
                       optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
                       ::operator*(perConfigCompileDefinitions);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>
                       ::operator[](pmVar7,(key_type *)local_160);
              pmVar8->Value = local_1e8.Value;
              bVar1 = cmValue::operator_cast_to_bool(&local_1e8);
              if (bVar1) {
                psVar9 = cmValue::operator*[abi_cxx11_(&local_1e8);
                std::optional<cmListFileBacktrace>::optional();
                AppendProperty(this,(string *)local_160,psVar9,&local_200,false);
                std::optional<cmListFileBacktrace>::~optional(&local_200);
              }
              std::__cxx11::string::~string((string *)local_160);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end3_1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range3_1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cmTarget::FinalizeTargetConfiguration(
  const cmBTStringRange& noConfigCompileDefinitions,
  cm::optional<std::map<std::string, cmValue>>& perConfigCompileDefinitions)
{
  if (this->GetType() == cmStateEnums::GLOBAL_TARGET) {
    return;
  }

  if (!CheckLinkLibraryPattern("LINK_LIBRARIES"_s,
                               this->impl->LinkImplementationPropertyEntries,
                               this->GetMakefile()->GetCMakeInstance()) ||
      !CheckLinkLibraryPattern("INTERFACE_LINK_LIBRARIES"_s,
                               this->impl->LinkInterfacePropertyEntries,
                               this->GetMakefile()->GetCMakeInstance()) ||
      !CheckLinkLibraryPattern("INTERFACE_LINK_LIBRARIES_DIRECT"_s,
                               this->impl->LinkInterfaceDirectPropertyEntries,
                               this->GetMakefile()->GetCMakeInstance())) {
    return;
  }

  this->AppendBuildInterfaceIncludes();

  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return;
  }

  for (auto const& def : noConfigCompileDefinitions) {
    this->InsertCompileDefinition(def);
  }

  auto* mf = this->GetMakefile();
  cmPolicies::PolicyStatus polSt = mf->GetPolicyStatus(cmPolicies::CMP0043);
  if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD) {
    if (perConfigCompileDefinitions) {
      for (auto const& it : *perConfigCompileDefinitions) {
        if (cmValue val = it.second) {
          this->AppendProperty(it.first, *val);
        }
      }
    } else {
      perConfigCompileDefinitions.emplace();
      std::vector<std::string> configs =
        mf->GetGeneratorConfigs(cmMakefile::ExcludeEmptyConfig);

      for (std::string const& c : configs) {
        std::string defPropName =
          cmStrCat("COMPILE_DEFINITIONS_", cmSystemTools::UpperCase(c));
        cmValue val = mf->GetProperty(defPropName);
        (*perConfigCompileDefinitions)[defPropName] = val;
        if (val) {
          this->AppendProperty(defPropName, *val);
        }
      }
    }
  }
}